

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_buf_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  size_t boffset;
  cr_buf_ctx *ctx;
  curl_off_t offset_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  if (*(long *)((long)pvVar1 + 0x30) == 0) {
    if (offset < 1) {
      data_local._4_4_ = CURLE_OK;
    }
    else if (*(ulong *)((long)pvVar1 + 0x28) < (ulong)offset) {
      data_local._4_4_ = CURLE_READ_ERROR;
    }
    else {
      *(curl_off_t *)((long)pvVar1 + 0x20) = offset + *(long *)((long)pvVar1 + 0x20);
      *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) - offset;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = CURLE_READ_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cr_buf_resume_from(struct Curl_easy *data,
                                   struct Curl_creader *reader,
                                   curl_off_t offset)
{
  struct cr_buf_ctx *ctx = reader->ctx;
  size_t boffset;

  (void)data;
  DEBUGASSERT(data->conn);
  /* already started reading? */
  if(ctx->index)
    return CURLE_READ_ERROR;
  if(offset <= 0)
    return CURLE_OK;
  boffset = (size_t)offset;
  if(boffset > ctx->blen)
    return CURLE_READ_ERROR;

  ctx->buf += boffset;
  ctx->blen -= boffset;
  return CURLE_OK;
}